

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::Swap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  uint32 uVar1;
  int iVar2;
  int *piVar3;
  string *psVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  int iVar6;
  int iVar7;
  
  if (other != this) {
    piVar3 = (this->path_).elements_;
    (this->path_).elements_ = (other->path_).elements_;
    iVar2 = (other->path_).total_size_;
    (other->path_).elements_ = piVar3;
    iVar6 = (this->path_).current_size_;
    iVar7 = (this->path_).total_size_;
    (this->path_).current_size_ = (other->path_).current_size_;
    (this->path_).total_size_ = iVar2;
    (other->path_).current_size_ = iVar6;
    (other->path_).total_size_ = iVar7;
    piVar3 = (this->span_).elements_;
    (this->span_).elements_ = (other->span_).elements_;
    iVar2 = (other->span_).total_size_;
    (other->span_).elements_ = piVar3;
    iVar6 = (this->span_).current_size_;
    iVar7 = (this->span_).total_size_;
    (this->span_).current_size_ = (other->span_).current_size_;
    (this->span_).total_size_ = iVar2;
    (other->span_).current_size_ = iVar6;
    (other->span_).total_size_ = iVar7;
    psVar4 = this->leading_comments_;
    this->leading_comments_ = other->leading_comments_;
    other->leading_comments_ = psVar4;
    psVar4 = this->trailing_comments_;
    this->trailing_comments_ = other->trailing_comments_;
    other->trailing_comments_ = psVar4;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::Swap(SourceCodeInfo_Location* other) {
  if (other != this) {
    path_.Swap(&other->path_);
    span_.Swap(&other->span_);
    std::swap(leading_comments_, other->leading_comments_);
    std::swap(trailing_comments_, other->trailing_comments_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}